

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

int av1_get_q_index_from_qstep_ratio(int leaf_qindex,double qstep_ratio,aom_bit_depth_t bit_depth)

{
  int16_t iVar1;
  int16_t iVar2;
  int in_EDI;
  double in_XMM0_Qa;
  double qstep_1;
  double qstep;
  int qindex;
  double target_qstep;
  double leaf_qstep;
  aom_bit_depth_t in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  double in_stack_ffffffffffffffc0;
  int local_2c;
  
  iVar1 = av1_dc_quant_QTX(SUB84(in_stack_ffffffffffffffc0,0),in_stack_ffffffffffffffbc,
                           in_stack_ffffffffffffffb8);
  local_2c = in_EDI;
  if (1.0 <= in_XMM0_Qa) {
    for (; local_2c < 0x100; local_2c = local_2c + 1) {
      iVar2 = av1_dc_quant_QTX(SUB84(in_stack_ffffffffffffffc0,0),in_stack_ffffffffffffffbc,
                               in_stack_ffffffffffffffb8);
      in_stack_ffffffffffffffc0 = (double)(int)iVar2;
      if ((double)(int)iVar1 * in_XMM0_Qa <= in_stack_ffffffffffffffc0) {
        return local_2c;
      }
    }
  }
  else {
    while ((0 < local_2c &&
           (iVar2 = av1_dc_quant_QTX(SUB84(in_stack_ffffffffffffffc0,0),in_stack_ffffffffffffffbc,
                                     in_stack_ffffffffffffffb8),
           (double)(int)iVar1 * in_XMM0_Qa < (double)(int)iVar2))) {
      local_2c = local_2c + -1;
    }
  }
  return local_2c;
}

Assistant:

int av1_get_q_index_from_qstep_ratio(int leaf_qindex, double qstep_ratio,
                                     aom_bit_depth_t bit_depth) {
  const double leaf_qstep = av1_dc_quant_QTX(leaf_qindex, 0, bit_depth);
  const double target_qstep = leaf_qstep * qstep_ratio;
  int qindex = leaf_qindex;
  if (qstep_ratio < 1.0) {
    for (qindex = leaf_qindex; qindex > 0; --qindex) {
      const double qstep = av1_dc_quant_QTX(qindex, 0, bit_depth);
      if (qstep <= target_qstep) break;
    }
  } else {
    for (qindex = leaf_qindex; qindex <= MAXQ; ++qindex) {
      const double qstep = av1_dc_quant_QTX(qindex, 0, bit_depth);
      if (qstep >= target_qstep) break;
    }
  }
  return qindex;
}